

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O0

void av1_iadst16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t *piVar3;
  long in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [16];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int32_t local_88;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  undefined3 local_74;
  int8_t in_stack_ffffffffffffff8f;
  int local_6c;
  int local_68;
  int32_t local_64;
  int32_t local_60;
  int local_5c;
  int32_t local_58;
  int local_54;
  int local_50;
  int32_t local_4c;
  
  piVar3 = cospi_arr((int)in_DL);
  *in_RSI = in_RDI[0xf];
  in_RSI[1] = *in_RDI;
  in_RSI[2] = in_RDI[0xd];
  in_RSI[3] = in_RDI[2];
  in_RSI[4] = in_RDI[0xb];
  in_RSI[5] = in_RDI[4];
  in_RSI[6] = in_RDI[9];
  in_RSI[7] = in_RDI[6];
  in_RSI[8] = in_RDI[7];
  in_RSI[9] = in_RDI[8];
  in_RSI[10] = in_RDI[5];
  in_RSI[0xb] = in_RDI[10];
  in_RSI[0xc] = in_RDI[3];
  in_RSI[0xd] = in_RDI[0xc];
  in_RSI[0xe] = in_RDI[1];
  in_RSI[0xf] = in_RDI[0xe];
  av1_range_check_buf(1,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 1));
  half_btf(piVar3[2],*in_RSI,piVar3[0x3e],in_RSI[1],(int)in_DL);
  half_btf(piVar3[0x3e],*in_RSI,-piVar3[2],in_RSI[1],(int)in_DL);
  half_btf(piVar3[10],in_RSI[2],piVar3[0x36],in_RSI[3],(int)in_DL);
  half_btf(piVar3[0x36],in_RSI[2],-piVar3[10],in_RSI[3],(int)in_DL);
  half_btf(piVar3[0x12],in_RSI[4],piVar3[0x2e],in_RSI[5],(int)in_DL);
  half_btf(piVar3[0x2e],in_RSI[4],-piVar3[0x12],in_RSI[5],(int)in_DL);
  iVar1 = half_btf(piVar3[0x1a],in_RSI[6],piVar3[0x26],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x26],in_RSI[6],-piVar3[0x1a],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x22],in_RSI[8],piVar3[0x1e],in_RSI[9],(int)in_DL);
  half_btf(piVar3[0x1e],in_RSI[8],-piVar3[0x22],in_RSI[9],(int)in_DL);
  half_btf(piVar3[0x2a],in_RSI[10],piVar3[0x16],in_RSI[0xb],(int)in_DL);
  half_btf(piVar3[0x16],in_RSI[10],-piVar3[0x2a],in_RSI[0xb],(int)in_DL);
  half_btf(piVar3[0x32],in_RSI[0xc],piVar3[0xe],in_RSI[0xd],(int)in_DL);
  half_btf(piVar3[0xe],in_RSI[0xc],-piVar3[0x32],in_RSI[0xd],(int)in_DL);
  half_btf(piVar3[0x3a],in_RSI[0xe],piVar3[6],in_RSI[0xf],(int)in_DL);
  half_btf(piVar3[6],in_RSI[0xe],-piVar3[0x3a],in_RSI[0xf],(int)in_DL);
  av1_range_check_buf(2,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 2));
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  *in_RSI = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[1] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[2] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[3] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[4] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[5] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[6] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[7] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[8] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[9] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[10] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xb] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xc] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xd] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xe] = iVar2;
  iVar1 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xf] = iVar1;
  av1_range_check_buf(3,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 3));
  local_88 = *in_RSI;
  iVar1 = in_RSI[6];
  half_btf(piVar3[8],in_RSI[8],piVar3[0x38],in_RSI[9],(int)in_DL);
  half_btf(piVar3[0x38],in_RSI[8],-piVar3[8],in_RSI[9],(int)in_DL);
  half_btf(piVar3[0x28],in_RSI[10],piVar3[0x18],in_RSI[0xb],(int)in_DL);
  half_btf(piVar3[0x18],in_RSI[10],-piVar3[0x28],in_RSI[0xb],(int)in_DL);
  half_btf(-piVar3[0x38],in_RSI[0xc],piVar3[8],in_RSI[0xd],(int)in_DL);
  half_btf(piVar3[8],in_RSI[0xc],piVar3[0x38],in_RSI[0xd],(int)in_DL);
  half_btf(-piVar3[0x18],in_RSI[0xe],piVar3[0x28],in_RSI[0xf],(int)in_DL);
  half_btf(piVar3[0x28],in_RSI[0xe],piVar3[0x18],in_RSI[0xf],(int)in_DL);
  av1_range_check_buf(4,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 4));
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  *in_RSI = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[1] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[2] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[3] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[4] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[5] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[6] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[7] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[8] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[9] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[10] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xb] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xc] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xd] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xe] = iVar2;
  iVar1 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xf] = iVar1;
  av1_range_check_buf(5,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 5));
  local_88 = *in_RSI;
  half_btf(piVar3[0x10],in_RSI[4],piVar3[0x30],in_RSI[5],(int)in_DL);
  half_btf(piVar3[0x30],in_RSI[4],-piVar3[0x10],in_RSI[5],(int)in_DL);
  iVar1 = half_btf(-piVar3[0x30],in_RSI[6],piVar3[0x10],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x10],in_RSI[6],piVar3[0x30],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x10],in_RSI[0xc],piVar3[0x30],in_RSI[0xd],(int)in_DL);
  half_btf(piVar3[0x30],in_RSI[0xc],-piVar3[0x10],in_RSI[0xd],(int)in_DL);
  half_btf(-piVar3[0x30],in_RSI[0xe],piVar3[0x10],in_RSI[0xf],(int)in_DL);
  half_btf(piVar3[0x10],in_RSI[0xe],piVar3[0x30],in_RSI[0xf],(int)in_DL);
  av1_range_check_buf(6,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 6));
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  *in_RSI = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[1] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[2] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[3] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[4] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[5] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[6] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[7] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[8] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[9] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[10] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xb] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xc] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xd] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xe] = iVar2;
  iVar1 = clamp_value(iVar1,in_stack_ffffffffffffff8f);
  in_RSI[0xf] = iVar1;
  av1_range_check_buf(7,in_RDI,in_RSI,0x10,*(int8_t *)(in_RCX + 7));
  local_88 = *in_RSI;
  local_84 = in_RSI[1];
  local_80 = half_btf(piVar3[0x20],in_RSI[2],piVar3[0x20],in_RSI[3],(int)in_DL);
  local_7c = half_btf(piVar3[0x20],in_RSI[2],-piVar3[0x20],in_RSI[3],(int)in_DL);
  local_78 = in_RSI[4];
  iVar1 = half_btf(piVar3[0x20],in_RSI[6],piVar3[0x20],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[6],-piVar3[0x20],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[10],piVar3[0x20],in_RSI[0xb],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[10],-piVar3[0x20],in_RSI[0xb],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[0xe],piVar3[0x20],in_RSI[0xf],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[0xe],-piVar3[0x20],in_RSI[0xf],(int)in_DL);
  av1_range_check_buf(8,in_RDI,&local_88,0x10,*(int8_t *)(in_RCX + 8));
  *in_RSI = local_88;
  in_RSI[1] = -local_68;
  in_RSI[2] = local_58;
  in_RSI[3] = -local_78;
  in_RSI[4] = iVar1;
  in_RSI[5] = -local_50;
  in_RSI[6] = local_60;
  in_RSI[7] = -local_80;
  in_RSI[8] = local_7c;
  in_RSI[9] = -local_5c;
  in_RSI[10] = local_4c;
  in_RSI[0xb] = -local_6c;
  in_RSI[0xc] = CONCAT13(in_stack_ffffffffffffff8f,local_74);
  in_RSI[0xd] = -local_54;
  in_RSI[0xe] = local_64;
  in_RSI[0xf] = -local_84;
  return;
}

Assistant:

void av1_iadst16(const int32_t *input, int32_t *output, int8_t cos_bit,
                 const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[15];
  bf1[1] = input[0];
  bf1[2] = input[13];
  bf1[3] = input[2];
  bf1[4] = input[11];
  bf1[5] = input[4];
  bf1[6] = input[9];
  bf1[7] = input[6];
  bf1[8] = input[7];
  bf1[9] = input[8];
  bf1[10] = input[5];
  bf1[11] = input[10];
  bf1[12] = input[3];
  bf1[13] = input[12];
  bf1[14] = input[1];
  bf1[15] = input[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[2], bf0[0], cospi[62], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[62], bf0[0], -cospi[2], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[10], bf0[2], cospi[54], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[54], bf0[2], -cospi[10], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[18], bf0[4], cospi[46], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[46], bf0[4], -cospi[18], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[26], bf0[6], cospi[38], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[38], bf0[6], -cospi[26], bf0[7], cos_bit);
  bf1[8] = half_btf(cospi[34], bf0[8], cospi[30], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[30], bf0[8], -cospi[34], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[42], bf0[10], cospi[22], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[22], bf0[10], -cospi[42], bf0[11], cos_bit);
  bf1[12] = half_btf(cospi[50], bf0[12], cospi[14], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[14], bf0[12], -cospi[50], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[58], bf0[14], cospi[6], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[6], bf0[14], -cospi[58], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[8], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[9], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[10], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[11], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[12], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[13], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[14], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[15], stage_range[stage]);
  bf1[8] = clamp_value(bf0[0] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[1] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[2] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[3] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[4] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[5] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[6] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[7] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[8], bf0[8], cospi[56], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[56], bf0[8], -cospi[8], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[40], bf0[10], cospi[24], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[24], bf0[10], -cospi[40], bf0[11], cos_bit);
  bf1[12] = half_btf(-cospi[56], bf0[12], cospi[8], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[8], bf0[12], cospi[56], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[24], bf0[14], cospi[40], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[40], bf0[14], cospi[24], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[12], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[13], stage_range[stage]);
  bf1[10] = clamp_value(bf0[10] + bf0[14], stage_range[stage]);
  bf1[11] = clamp_value(bf0[11] + bf0[15], stage_range[stage]);
  bf1[12] = clamp_value(bf0[8] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[9] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[10] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[11] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = bf0[10];
  bf1[11] = bf0[11];
  bf1[12] = half_btf(cospi[16], bf0[12], cospi[48], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[48], bf0[12], -cospi[16], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[48], bf0[14], cospi[16], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[16], bf0[14], cospi[48], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[10], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[11], stage_range[stage]);
  bf1[10] = clamp_value(bf0[8] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[9] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[14], stage_range[stage]);
  bf1[13] = clamp_value(bf0[13] + bf0[15], stage_range[stage]);
  bf1[14] = clamp_value(bf0[12] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[13] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 8
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(cospi[32], bf0[10], cospi[32], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[32], bf0[10], -cospi[32], bf0[11], cos_bit);
  bf1[12] = bf0[12];
  bf1[13] = bf0[13];
  bf1[14] = half_btf(cospi[32], bf0[14], cospi[32], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[32], bf0[14], -cospi[32], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 9
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[8];
  bf1[2] = bf0[12];
  bf1[3] = -bf0[4];
  bf1[4] = bf0[6];
  bf1[5] = -bf0[14];
  bf1[6] = bf0[10];
  bf1[7] = -bf0[2];
  bf1[8] = bf0[3];
  bf1[9] = -bf0[11];
  bf1[10] = bf0[15];
  bf1[11] = -bf0[7];
  bf1[12] = bf0[5];
  bf1[13] = -bf0[13];
  bf1[14] = bf0[9];
  bf1[15] = -bf0[1];
}